

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::VRegistry::setModules(VRegistry *this,char *modules)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  bool local_259;
  bool local_24d;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  string local_1f8 [32];
  int local_1d8;
  int level;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [382];
  byte local_3a;
  byte local_39;
  undefined1 auStack_38 [6];
  bool isLevel;
  bool isMod;
  anon_class_16_2_658133bf insert;
  anon_class_1_0_00000001 addSuffix;
  ScopedLock scopedLock;
  char *modules_local;
  VRegistry *this_local;
  
  iVar1 = (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&stack0xffffffffffffffe0,
             (NoMutex *)CONCAT44(extraout_var,iVar1));
  insert.this = (VRegistry *)((long)&insert.addSuffix + 7);
  local_39 = 1;
  local_3a = 0;
  _auStack_38 = this;
  std::__cxx11::stringstream::stringstream(local_1c8);
  local_1d8 = -1;
  for (scopedLock._vptr_NoScopedLock = (_func_int **)modules;
      *(char *)scopedLock._vptr_NoScopedLock != '\0';
      scopedLock._vptr_NoScopedLock = scopedLock._vptr_NoScopedLock + 1) {
    if (*(char *)scopedLock._vptr_NoScopedLock == ',') {
      local_3a = 0;
      local_39 = 1;
      std::__cxx11::stringstream::str();
      uVar2 = std::__cxx11::string::empty();
      local_24d = (uVar2 & 1) == 0 && local_1d8 != -1;
      std::__cxx11::string::~string(local_1f8);
      if (local_24d) {
        setModules::anon_class_16_2_658133bf::operator()
                  ((anon_class_16_2_658133bf *)auStack_38,(stringstream *)local_1c8,
                   (VerboseLevel)local_1d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_218,"",&local_219);
        std::__cxx11::stringstream::str((string *)local_1c8);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
        local_1d8 = -1;
      }
    }
    else if (*(char *)scopedLock._vptr_NoScopedLock == '=') {
      local_3a = 1;
      local_39 = 0;
    }
    else if ((local_39 & 1) == 0) {
      if (((local_3a & 1) != 0) &&
         (iVar1 = isdigit((int)*(char *)scopedLock._vptr_NoScopedLock), iVar1 != 0)) {
        local_1d8 = ((int)*(char *)scopedLock._vptr_NoScopedLock & 0xffffU) - 0x30;
      }
    }
    else {
      std::operator<<(local_1b8,*(char *)scopedLock._vptr_NoScopedLock);
    }
  }
  std::__cxx11::stringstream::str();
  uVar2 = std::__cxx11::string::empty();
  local_259 = (uVar2 & 1) == 0 && local_1d8 != -1;
  std::__cxx11::string::~string(local_240);
  if (local_259) {
    setModules::anon_class_16_2_658133bf::operator()
              ((anon_class_16_2_658133bf *)auStack_38,(stringstream *)local_1c8,
               (VerboseLevel)local_1d8);
  }
  std::__cxx11::stringstream::~stringstream(local_1c8);
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void VRegistry::setModules(const char* modules) {
  base::threading::ScopedLock scopedLock(lock());
  auto addSuffix = [](std::stringstream& ss, const char* sfx, const char* prev) {
    if (prev != nullptr && base::utils::Str::endsWith(ss.str(), std::string(prev))) {
      std::string chr(ss.str().substr(0, ss.str().size() - strlen(prev)));
      ss.str(std::string(""));
      ss << chr;
    }
    if (base::utils::Str::endsWith(ss.str(), std::string(sfx))) {
      std::string chr(ss.str().substr(0, ss.str().size() - strlen(sfx)));
      ss.str(std::string(""));
      ss << chr;
    }
    ss << sfx;
  };
  auto insert = [&](std::stringstream& ss, base::type::VerboseLevel level) {
    if (!base::utils::hasFlag(LoggingFlag::DisableVModulesExtensions, *m_pFlags)) {
      addSuffix(ss, ".h", nullptr);
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".c", ".h");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".cpp", ".c");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".cc", ".cpp");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".cxx", ".cc");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".-inl.h", ".cxx");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".hxx", ".-inl.h");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".hpp", ".hxx");
      m_modules.insert(std::make_pair(ss.str(), level));
      addSuffix(ss, ".hh", ".hpp");
    }
    m_modules.insert(std::make_pair(ss.str(), level));
  };
  bool isMod = true;
  bool isLevel = false;
  std::stringstream ss;
  int level = -1;
  for (; *modules; ++modules) {
    switch (*modules) {
    case '=':
      isLevel = true;
      isMod = false;
      break;
    case ',':
      isLevel = false;
      isMod = true;
      if (!ss.str().empty() && level != -1) {
        insert(ss, static_cast<base::type::VerboseLevel>(level));
        ss.str(std::string(""));
        level = -1;
      }
      break;
    default:
      if (isMod) {
        ss << *modules;
      } else if (isLevel) {
        if (isdigit(*modules)) {
          level = static_cast<base::type::VerboseLevel>(*modules) - 48;
        }
      }
      break;
    }
  }
  if (!ss.str().empty() && level != -1) {
    insert(ss, static_cast<base::type::VerboseLevel>(level));
  }
}